

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wln.h
# Opt level: O1

int Wln_ObjRange(Wln_Ntk_t *p,int i)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  if ((-1 < i) && (i < (p->vRanges).nSize)) {
    iVar4 = (p->vRanges).pArray[(uint)i];
    if (-1 < iVar4) {
      pVVar1 = p->pRanges->vObjs;
      uVar3 = iVar4 * 4;
      if ((int)uVar3 < pVVar1->nSize) {
        piVar2 = pVVar1->pArray;
        iVar5 = piVar2[uVar3] - piVar2[(ulong)uVar3 + 1];
        iVar4 = -iVar5;
        if (0 < iVar5) {
          iVar4 = iVar5;
        }
        return iVar4 + 1;
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int          Wln_ObjRange( Wln_Ntk_t * p, int i )                  { return 1 + Abc_AbsInt(Wln_ObjRangeEnd(p, i)-Wln_ObjRangeBeg(p, i));        }